

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip,void *pMem,size_t size,mz_uint32 flags)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  mz_bool mVar3;
  
  mVar2 = (anonymous_namespace)::miniz::mz_zip_reader_init_internal(pZip,(mz_uint32)pMem);
  mVar3 = 0;
  if (mVar2 != 0) {
    pZip->m_archive_size = size;
    pZip->m_pRead = (anonymous_namespace)::miniz::mz_zip_mem_read_func;
    pZip->m_pIO_opaque = pZip;
    pmVar1 = pZip->m_pState;
    pmVar1->m_pMem = pMem;
    pmVar1->m_mem_size = size;
    mVar2 = (anonymous_namespace)::miniz::mz_zip_reader_read_central_dir(pZip,flags);
    mVar3 = 1;
    if (mVar2 == 0) {
      mz_zip_reader_end(pZip);
      mVar3 = 0;
    }
  }
  return mVar3;
}

Assistant:

mz_bool mz_zip_reader_init_mem(mz_zip_archive *pZip, const void *pMem,
                               size_t size, mz_uint32 flags) {
  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;
  pZip->m_archive_size = size;
  pZip->m_pRead = mz_zip_mem_read_func;
  pZip->m_pIO_opaque = pZip;
#ifdef __cplusplus
  pZip->m_pState->m_pMem = const_cast<void *>(pMem);
#else
  pZip->m_pState->m_pMem = (void *)pMem;
#endif
  pZip->m_pState->m_mem_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}